

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (Random *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *vec)

{
  pointer pNVar1;
  pointer pNVar2;
  uint32_t uVar3;
  
  pNVar1 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar2 = (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pNVar1 != pNVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pNVar2 - (long)pNVar1) >> 4));
    return (vec->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Name>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }